

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O3

string * __thiscall
t_javame_generator::get_enum_class_name_abi_cxx11_
          (string *__return_storage_ptr__,t_javame_generator *this,t_type *type)

{
  t_program *this_00;
  int iVar1;
  long *plVar2;
  undefined4 extraout_var;
  long *plVar3;
  string package;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  this_00 = type->program_;
  if ((this_00 != (t_program *)0x0) &&
     (this_00 != (this->super_t_oop_generator).super_t_generator.program_)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"java","");
    t_program::get_namespace(&local_70,this_00,&local_90);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_40 = *plVar3;
      lStack_38 = plVar2[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar3;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[3])(type);
  std::operator+(__return_storage_ptr__,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_javame_generator::get_enum_class_name(t_type* type) {
  string package = "";
  t_program* program = type->get_program();
  if (program != nullptr && program != program_) {
    package = program->get_namespace("java") + ".";
  }
  return package + type->get_name();
}